

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall estl::shared_ptr<MyClass>::control_block::dbg(control_block *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"*** FIXMENM use count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," control count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",  this: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void dbg() {
            std::cerr << "*** FIXMENM use count: " << use_count_ << " control count: " << control_block_count_ <<  ",  this: " << this << "\n";
        }